

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,format_specs<char> *specs,
          digit_grouping<char> *grouping)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 n [16];
  undefined1 value_00 [16];
  size_t sVar5;
  uint uVar6;
  char *digits;
  char *pcVar7;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar8;
  char *pcVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined4 in_register_00000014;
  byte *pbVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  undefined8 *in_R9;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  format_decimal_result<char_*> fVar23;
  undefined4 in_stack_fffffffffffffd18;
  anon_class_24_3_e2c60416 local_2d8;
  undefined3 uStack_2c0;
  undefined4 uStack_2bd;
  undefined1 uStack_2b9;
  undefined1 uStack_2b8;
  undefined2 uStack_2b7;
  undefined4 uStack_2b5;
  undefined4 uStack_2b1;
  memory_buffer local_248;
  
  uVar12 = CONCAT44(in_register_00000014,prefix);
  uVar6 = (uint)specs;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_003aa980;
  local_248.super_buffer<char>.capacity_ = 500;
  cVar1 = (char)(grouping->grouping_)._M_string_length;
  switch(cVar1) {
  case '\0':
  case '\x01':
    n._4_4_ = uVar6;
    n._0_4_ = in_stack_fffffffffffffd18;
    n._8_8_ = this;
    uVar16 = count_digits_fallback<unsigned__int128>
                       ((detail *)
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                        (unsigned___int128)n);
    uVar19 = (ulong)uVar16;
    local_2d8.buffer = (memory_buffer *)0x0;
    uStack_2c0 = 0;
    uStack_2bd = 0;
    local_2d8.prefix = (uint *)0x0;
    local_2d8.grouping = (digit_grouping<char> *)0x0;
    uStack_2b9 = 0;
    uStack_2b8 = 0;
    uStack_2b7 = 0;
    uStack_2b5 = 0;
    value_00._4_4_ = uVar6;
    value_00._0_4_ = in_stack_fffffffffffffd18;
    value_00._8_8_ = this;
    fVar23 = format_decimal<char,unsigned__int128>
                       ((detail *)&local_2d8,
                        (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container,(unsigned___int128)value_00,prefix);
    copy_str_noinline<char,char*,fmt::v10::appender>
              ((char *)&local_2d8,fVar23.end,(appender)&local_248);
    break;
  case '\x02':
    uVar11 = uVar12;
    bVar8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    uVar19 = 0;
    do {
      uVar20 = uVar19;
      uVar3 = uVar11 << 0x3d;
      uVar19 = uVar20 + 1;
      bVar21 = (buffer<char> *)0x7 < bVar8.container;
      bVar22 = uVar11 != 0;
      uVar4 = -uVar11;
      uVar11 = uVar11 >> 3;
      bVar8.container = (buffer<char> *)(uVar3 | (ulong)bVar8.container >> 3);
    } while (bVar22 || uVar4 < bVar21);
    if ((((grouping->grouping_)._M_string_length & 0x8000) != 0) &&
       ((out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container !=
         (buffer<char> *)0x0 || uVar12 != 0) &&
        *(int *)((long)&(grouping->grouping_)._M_dataplus._M_p + 4) <= (int)uVar19)) {
      uVar16 = 0x3000;
      if (uVar6 == 0) {
        uVar16 = 0x30;
      }
      uVar6 = (uVar16 | uVar6) + 0x1000000;
    }
    pcVar7 = local_248.super_buffer<char>.ptr_;
    sVar5 = uVar19;
    if (500 < uVar19) {
      pcVar7 = (char *)0x0;
      sVar5 = local_248.super_buffer<char>.size_;
    }
    local_248.super_buffer<char>.size_ = sVar5;
    if (pcVar7 == (char *)0x0) {
      pbVar10 = (byte *)((long)&local_2d8.prefix + uVar20);
      uStack_2b8 = 0;
      uStack_2b7 = 0;
      uStack_2b5 = 0;
      uStack_2b1 = 0;
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      do {
        *pbVar10 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0
                        ) & 7 | 0x30;
        uVar11 = uVar12 << 0x3d;
        pbVar10 = pbVar10 + -1;
        bVar21 = (buffer<char> *)0x7 <
                 (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        bVar22 = uVar12 != 0;
        uVar3 = -uVar12;
        uVar12 = uVar12 >> 3;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar11 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 3);
      } while (bVar22 || uVar3 < bVar21);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar20 + 1),
                 (appender)&local_248);
    }
    else {
      pcVar7 = pcVar7 + uVar19;
      do {
        pcVar7 = pcVar7 + -1;
        uVar11 = uVar12 << 0x3d;
        *pcVar7 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0)
                  & 7 | 0x30;
        bVar21 = ((ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container <
                 (buffer<char> *)0x8) <= uVar12;
        uVar12 = uVar12 >> 3;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar11 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 3);
      } while (bVar21);
    }
    break;
  case '\x03':
  case '\x04':
    if (((grouping->grouping_)._M_string_length & 0x8000) != 0) {
      uVar13 = (uint)(cVar1 != '\x04') << 0xd | 0x5830;
      uVar16 = uVar13 << 8;
      if (uVar6 == 0) {
        uVar16 = uVar13;
      }
      uVar6 = (uVar16 | uVar6) + 0x2000000;
    }
    uVar11 = uVar12;
    bVar8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    uVar19 = 0;
    do {
      uVar20 = uVar19;
      uVar3 = uVar11 << 0x3c;
      uVar19 = uVar20 + 1;
      bVar21 = (buffer<char> *)0xf < bVar8.container;
      bVar22 = uVar11 != 0;
      uVar4 = -uVar11;
      uVar11 = uVar11 >> 4;
      bVar8.container = (buffer<char> *)(uVar3 | (ulong)bVar8.container >> 4);
    } while (bVar22 || uVar4 < bVar21);
    pcVar7 = local_248.super_buffer<char>.ptr_;
    sVar5 = uVar19;
    if (500 < uVar19) {
      pcVar7 = (char *)0x0;
      sVar5 = local_248.super_buffer<char>.size_;
    }
    local_248.super_buffer<char>.size_ = sVar5;
    if (pcVar7 == (char *)0x0) {
      pcVar9 = (char *)((long)&local_2d8.prefix + uVar20);
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      uStack_2b8 = 0;
      pcVar7 = "0123456789abcdef";
      if (cVar1 == '\x04') {
        pcVar7 = "0123456789ABCDEF";
      }
      do {
        *pcVar9 = pcVar7[SUB84(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container,0) & 0xf];
        pcVar9 = pcVar9 + -1;
        bVar21 = (buffer<char> *)0xf <
                 (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        bVar22 = uVar12 != 0;
        uVar11 = -uVar12;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar12 << 0x3c |
             (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container >> 4);
        uVar12 = uVar12 >> 4;
      } while (bVar22 || uVar11 < bVar21);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar20 + 1),
                 (appender)&local_248);
    }
    else {
      pcVar9 = "0123456789abcdef";
      if (cVar1 == '\x04') {
        pcVar9 = "0123456789ABCDEF";
      }
      pcVar7 = pcVar7 + uVar19;
      do {
        pcVar7 = pcVar7 + -1;
        uVar11 = uVar12 << 0x3c;
        *pcVar7 = pcVar9[SUB84(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container,0) & 0xf];
        bVar21 = ((ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container <
                 (buffer<char> *)0x10) <= uVar12;
        uVar12 = uVar12 >> 4;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar11 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 4);
      } while (bVar21);
    }
    break;
  case '\x05':
  case '\x06':
    if (((grouping->grouping_)._M_string_length & 0x8000) != 0) {
      uVar13 = (uint)(cVar1 != '\x06') << 0xd | 0x4230;
      uVar16 = uVar13 << 8;
      if (uVar6 == 0) {
        uVar16 = uVar13;
      }
      uVar6 = (uVar16 | uVar6) + 0x2000000;
    }
    uVar11 = uVar12;
    bVar8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    uVar19 = 0;
    do {
      uVar20 = uVar19;
      uVar3 = uVar11 << 0x3f;
      uVar19 = uVar20 + 1;
      bVar21 = (buffer<char> *)0x1 < bVar8.container;
      bVar22 = uVar11 != 0;
      uVar4 = -uVar11;
      uVar11 = uVar11 >> 1;
      bVar8.container = (buffer<char> *)(uVar3 | (ulong)bVar8.container >> 1);
    } while (bVar22 || uVar4 < bVar21);
    pcVar7 = local_248.super_buffer<char>.ptr_;
    sVar5 = uVar19;
    if (500 < uVar19) {
      pcVar7 = (char *)0x0;
      sVar5 = local_248.super_buffer<char>.size_;
    }
    local_248.super_buffer<char>.size_ = sVar5;
    if (pcVar7 == (char *)0x0) {
      pbVar10 = (byte *)((long)&local_2d8.prefix + uVar20);
      memset(&local_2d8,0,0x81);
      do {
        *pbVar10 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0
                        ) & 1 | 0x30;
        uVar11 = uVar12 << 0x3f;
        pbVar10 = pbVar10 + -1;
        bVar21 = (buffer<char> *)0x1 <
                 (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        bVar22 = uVar12 != 0;
        uVar3 = -uVar12;
        uVar12 = uVar12 >> 1;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar11 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 1);
      } while (bVar22 || uVar3 < bVar21);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar20 + 1),
                 (appender)&local_248);
    }
    else {
      pcVar7 = pcVar7 + uVar19;
      do {
        pcVar7 = pcVar7 + -1;
        uVar11 = uVar12 << 0x3f;
        *pcVar7 = SUB81(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,0)
                  & 1 | 0x30;
        bVar21 = ((ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container <
                 (buffer<char> *)0x2) <= uVar12;
        uVar12 = uVar12 >> 1;
        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (buffer<char> *)
             (uVar11 | (ulong)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container >> 1);
      } while (bVar21);
    }
    break;
  default:
    throw_format_error("invalid format specifier");
  case '\x0f':
    local_2d8.prefix._0_2_ =
         CONCAT11((char)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                  cVar1 == '\x12');
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                   ((appender)this,(format_specs<char> *)grouping,1,1,
                    (anon_class_2_2_bf5026b7 *)&local_2d8);
    goto LAB_00298138;
  }
  iVar18 = (int)uVar19;
  if (iVar18 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                ,0x189,"negative value");
  }
  pbVar10 = (byte *)*in_R9;
  pbVar14 = pbVar10 + in_R9[1];
  uVar6 = ((uVar6 >> 0x18) + iVar18) - 1;
  iVar15 = 0;
  do {
    iVar17 = 0x7fffffff;
    if (in_R9[5] != 0) {
      if (pbVar10 == pbVar14) {
        uVar16 = (uint)(char)pbVar14[-1];
      }
      else {
        bVar2 = *pbVar10;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00298102;
        pbVar10 = pbVar10 + 1;
        uVar16 = (uint)bVar2;
      }
      iVar15 = iVar15 + uVar16;
      iVar17 = iVar15;
    }
LAB_00298102:
    uVar6 = uVar6 + 1;
  } while (iVar17 < iVar18);
  local_2d8.prefix = (uint *)&stack0xfffffffffffffd1c;
  local_2d8.buffer = &local_248;
  bVar8.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>(fmt::v10::appender,unsigned__int128,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 ((appender)this,(format_specs<char> *)grouping,(ulong)uVar6,(ulong)uVar6,&local_2d8
                 );
LAB_00298138:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar8.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}